

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::PaddingLayerParams::_InternalSerialize
          (PaddingLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  PaddingLayerParams_PaddingConstant *this_00;
  PaddingLayerParams_PaddingReflection *this_01;
  PaddingLayerParams_PaddingReplication *this_02;
  void *data;
  uint32_t uVar2;
  ulong uVar3;
  int size;
  BorderAmounts *this_03;
  size_t __n;
  uint8_t *puVar4;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->PaddingType_).constant_;
    *target = '\n';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = PaddingLayerParams_PaddingConstant::_InternalSerialize(this_00,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->PaddingType_).reflection_;
    *target = '\x12';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = PaddingLayerParams_PaddingReflection::_InternalSerialize(this_01,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_02 = (this->PaddingType_).replication_;
    *target = '\x1a';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = PaddingLayerParams_PaddingReplication::_InternalSerialize(this_02,puVar4,stream);
  }
  this_03 = this->paddingamounts_;
  if (this_03 != (BorderAmounts *)0x0 &&
      this != (PaddingLayerParams *)_PaddingLayerParams_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_03 = this->paddingamounts_;
    }
    *target = 'R';
    uVar1 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = BorderAmounts::_InternalSerialize(this_03,puVar4,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* PaddingLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.PaddingLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
  if (_internal_has_constant()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::constant(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
  if (_internal_has_reflection()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::reflection(this), target, stream);
  }

  // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
  if (_internal_has_replication()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::replication(this), target, stream);
  }

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->_internal_has_paddingamounts()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::paddingamounts(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.PaddingLayerParams)
  return target;
}